

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void allocStatement(void)

{
  int a;
  item *x;
  object *y;
  typeDesc *ptVar1;
  char *msg;
  
  x = (item *)calloc(1,0x30);
  if (currentSymbol == 0x12d) {
    getSymbol();
    if (currentSymbol == 0x1f5) {
      getSymbol();
      y = find();
      makeItem(x,y);
      ptVar1 = getType(y->typeIndex);
      if (ptVar1->base->form == 0x323) {
        a = getReg();
        put(0x32,a,0,ptVar1->base->size);
        if (x->lev == 0) {
          x->a = x->a + RISC_MEMSIZE;
        }
        put(0x24,a,x->r,x->a);
        regs[a] = 0;
        if (currentSymbol == 0x12e) {
          getSymbol();
          semicolon();
          return;
        }
        msg = "missing closing right paran";
      }
      else {
        msg = "cannot alloc mem for datatype";
      }
    }
    else if (currentSymbol == 0x12e) {
      msg = "empty alloc";
    }
    else {
      msg = "missing identifier";
    }
  }
  else {
    msg = "missing left parantheses";
  }
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void allocStatement(void) {
	variable int r;
	variable struct object *obj;
	variable struct typeDesc *type;
	variable struct item *x;
	obj = NULL; type = NULL; x = NULL;
	allocMem(x);
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
		if (currentSymbol == SYMBOL_RPARAN) {
			mark("empty alloc");
			exit(-1);
		} else {
			if (currentSymbol == SYMBOL_IDENTIFIER) {
				getSymbol();
				obj = find();
				makeItem(x,obj);
				type = getType(obj->typeIndex); /* this is the reference type */
				if (type->base->form == FORM_RECORD) {
					r = getReg();
					put(RISC_ALL,r,0,type->base->size);
					if (x->lev == 0) {
						x->a = RISC_MEMSIZE + x->a;
					}
					put(RISC_STW,r,x->r,x->a);
					regs[r] = 0;
				} else {
					mark("cannot alloc mem for datatype");
					exit(-1);
				}
			} else {
				mark("missing identifier");
				exit(-1);
			}
		}
		if (currentSymbol == SYMBOL_RPARAN) {
			getSymbol();
		} else {
			mark("missing closing right paran");
			exit(-1);
		}
		semicolon();
	} else {
		mark("missing left parantheses");
		exit(-1);
	}
}